

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

int cmcmd_cmake_ninja_dyndep(const_iterator argBeg,const_iterator argEnd)

{
  bool bVar1;
  Value *pVVar2;
  cmGlobalNinjaGenerator *this;
  uint uVar3;
  string *this_00;
  char *m1;
  pointer str1;
  const_iterator cVar4;
  string dir_top_src;
  string dir_top_bld;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  linked_target_dirs;
  string dir_cur_src;
  Value tdio;
  undefined1 local_578 [32];
  string arg_tdi;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arg_ddis;
  string module_dir;
  string arg_lang;
  string arg_dd;
  SelfType local_4c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arg_full;
  string dir_cur_bld;
  cmake cm;
  
  cmSystemTools::HandleResponseFile(&arg_full,argBeg,argEnd);
  arg_dd._M_dataplus._M_p = (pointer)&arg_dd.field_2;
  arg_dd._M_string_length = 0;
  arg_lang._M_dataplus._M_p = (pointer)&arg_lang.field_2;
  arg_lang._M_string_length = 0;
  arg_tdi._M_dataplus._M_p = (pointer)&arg_tdi.field_2;
  arg_tdi._M_string_length = 0;
  arg_dd.field_2._M_local_buf[0] = '\0';
  arg_lang.field_2._M_local_buf[0] = '\0';
  arg_tdi.field_2._M_local_buf[0] = '\0';
  arg_ddis.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  arg_ddis.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  arg_ddis.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (str1 = arg_full.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
      str1 != arg_full.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish; str1 = str1 + 1) {
    bVar1 = cmHasLiteralPrefix<std::__cxx11::string,7ul>(str1,(char (*) [7])0x3f731c);
    if (bVar1) {
      std::__cxx11::string::substr((ulong)&cm,(ulong)str1);
      this_00 = &arg_tdi;
LAB_00244b44:
      std::__cxx11::string::operator=((string *)this_00,(string *)&cm);
      std::__cxx11::string::~string((string *)&cm);
    }
    else {
      bVar1 = cmHasLiteralPrefix<std::__cxx11::string,8ul>(str1,(char (*) [8])0x3f6be4);
      if (bVar1) {
        std::__cxx11::string::substr((ulong)&cm,(ulong)str1);
        this_00 = &arg_lang;
        goto LAB_00244b44;
      }
      bVar1 = cmHasLiteralPrefix<std::__cxx11::string,6ul>(str1,(char (*) [6])0x3f6c15);
      if (bVar1) {
        std::__cxx11::string::substr((ulong)&cm,(ulong)str1);
        this_00 = &arg_dd;
        goto LAB_00244b44;
      }
      bVar1 = cmHasLiteralPrefix<std::__cxx11::string,3ul>(str1,(char (*) [3])0x42940a);
      if (bVar1) {
LAB_00244dcd:
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cm,
                       "-E cmake_ninja_dyndep unknown argument: ",str1);
        cmSystemTools::Error((string *)&cm);
        std::__cxx11::string::~string((string *)&cm);
        goto LAB_00244e1b;
      }
      bVar1 = cmHasLiteralSuffix<std::__cxx11::string,5ul>(str1,(char (*) [5])".ddi");
      if (!bVar1) goto LAB_00244dcd;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&arg_ddis,str1);
    }
  }
  if (arg_tdi._M_string_length == 0) {
    m1 = "-E cmake_ninja_dyndep requires value for --tdi=";
  }
  else if (arg_lang._M_string_length == 0) {
    m1 = "-E cmake_ninja_dyndep requires value for --lang=";
  }
  else {
    if (arg_dd._M_string_length != 0) {
      Json::Value::Value(&tdio,nullValue);
      std::ifstream::ifstream(&cm,arg_tdi._M_dataplus._M_p,_S_in|_S_bin);
      Json::Reader::Reader((Reader *)&dir_cur_bld);
      bVar1 = Json::Reader::parse((Reader *)&dir_cur_bld,(istream *)&cm,&tdio,false);
      if (bVar1) {
        Json::Reader::~Reader((Reader *)&dir_cur_bld);
        std::ifstream::~ifstream(&cm);
        pVVar2 = Json::Value::operator[](&tdio,"dir-cur-bld");
        Json::Value::asString_abi_cxx11_(&dir_cur_bld,pVVar2);
        pVVar2 = Json::Value::operator[](&tdio,"dir-cur-src");
        Json::Value::asString_abi_cxx11_(&dir_cur_src,pVVar2);
        pVVar2 = Json::Value::operator[](&tdio,"dir-top-bld");
        Json::Value::asString_abi_cxx11_(&dir_top_bld,pVVar2);
        pVVar2 = Json::Value::operator[](&tdio,"dir-top-src");
        Json::Value::asString_abi_cxx11_(&dir_top_src,pVVar2);
        pVVar2 = Json::Value::operator[](&tdio,"module-dir");
        Json::Value::asString_abi_cxx11_(&module_dir,pVVar2);
        if (module_dir._M_string_length != 0) {
          bVar1 = cmHasLiteralSuffix<std::__cxx11::string,2ul>(&module_dir,(char (*) [2])0x435d0d);
          if (!bVar1) {
            std::__cxx11::string::append((char *)&module_dir);
          }
        }
        linked_target_dirs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        linked_target_dirs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        linked_target_dirs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pVVar2 = Json::Value::operator[](&tdio,"linked-target-dirs");
        bVar1 = Json::Value::isArray(pVVar2);
        if (bVar1) {
          cVar4 = Json::Value::begin(pVVar2);
          local_578._0_8_ = cVar4.super_ValueIteratorBase.current_._M_node;
          local_578[8] = cVar4.super_ValueIteratorBase.isNull_;
          cVar4 = Json::Value::end(pVVar2);
          local_4c0.current_ = cVar4.super_ValueIteratorBase.current_._M_node;
          local_4c0.isNull_ = cVar4.super_ValueIteratorBase.isNull_;
          while( true ) {
            bVar1 = Json::ValueIteratorBase::operator!=((ValueIteratorBase *)local_578,&local_4c0);
            if (!bVar1) break;
            pVVar2 = Json::ValueIteratorBase::deref((ValueIteratorBase *)local_578);
            Json::Value::asString_abi_cxx11_((string *)&cm,pVVar2);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &linked_target_dirs,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cm);
            std::__cxx11::string::~string((string *)&cm);
            Json::ValueIteratorBase::increment((ValueIteratorBase *)local_578);
          }
        }
        cmake::cmake(&cm,RoleInternal,Unknown);
        cmake::SetHomeDirectory(&cm,&dir_top_src);
        cmake::SetHomeOutputDirectory(&cm,&dir_top_bld);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_578,"Ninja",(allocator<char> *)&local_4c0);
        this = (cmGlobalNinjaGenerator *)cmake::CreateGlobalGenerator(&cm,(string *)local_578);
        std::__cxx11::string::~string((string *)local_578);
        if (this == (cmGlobalNinjaGenerator *)0x0) {
          uVar3 = 1;
        }
        else {
          bVar1 = cmGlobalNinjaGenerator::WriteDyndepFile
                            (this,&dir_top_src,&dir_top_bld,&dir_cur_src,&dir_cur_bld,&arg_dd,
                             &arg_ddis,&module_dir,&linked_target_dirs,&arg_lang);
          uVar3 = (uint)!bVar1;
          (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[1]
          )(this);
        }
        cmake::~cmake(&cm);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&linked_target_dirs);
        std::__cxx11::string::~string((string *)&module_dir);
        std::__cxx11::string::~string((string *)&dir_top_src);
        std::__cxx11::string::~string((string *)&dir_top_bld);
        std::__cxx11::string::~string((string *)&dir_cur_src);
        std::__cxx11::string::~string((string *)&dir_cur_bld);
      }
      else {
        std::operator+(&dir_top_bld,"-E cmake_ninja_dyndep failed to parse ",&arg_tdi);
        Json::Reader::getFormattedErrorMessages_abi_cxx11_(&dir_top_src,(Reader *)&dir_cur_bld);
        std::operator+(&dir_cur_src,&dir_top_bld,&dir_top_src);
        cmSystemTools::Error(&dir_cur_src);
        std::__cxx11::string::~string((string *)&dir_cur_src);
        std::__cxx11::string::~string((string *)&dir_top_src);
        std::__cxx11::string::~string((string *)&dir_top_bld);
        Json::Reader::~Reader((Reader *)&dir_cur_bld);
        std::ifstream::~ifstream(&cm);
        uVar3 = 1;
      }
      Json::Value::~Value(&tdio);
      goto LAB_00244e1e;
    }
    m1 = "-E cmake_ninja_dyndep requires value for --dd=";
  }
  cmSystemTools::Error(m1,(char *)0x0,(char *)0x0,(char *)0x0);
LAB_00244e1b:
  uVar3 = 1;
LAB_00244e1e:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&arg_ddis);
  std::__cxx11::string::~string((string *)&arg_tdi);
  std::__cxx11::string::~string((string *)&arg_lang);
  std::__cxx11::string::~string((string *)&arg_dd);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&arg_full);
  return uVar3;
}

Assistant:

int cmcmd_cmake_ninja_dyndep(std::vector<std::string>::const_iterator argBeg,
                             std::vector<std::string>::const_iterator argEnd)
{
  std::vector<std::string> arg_full =
    cmSystemTools::HandleResponseFile(argBeg, argEnd);

  std::string arg_dd;
  std::string arg_lang;
  std::string arg_tdi;
  std::vector<std::string> arg_ddis;
  for (std::string const& arg : arg_full) {
    if (cmHasLiteralPrefix(arg, "--tdi=")) {
      arg_tdi = arg.substr(6);
    } else if (cmHasLiteralPrefix(arg, "--lang=")) {
      arg_lang = arg.substr(7);
    } else if (cmHasLiteralPrefix(arg, "--dd=")) {
      arg_dd = arg.substr(5);
    } else if (!cmHasLiteralPrefix(arg, "--") &&
               cmHasLiteralSuffix(arg, ".ddi")) {
      arg_ddis.push_back(arg);
    } else {
      cmSystemTools::Error("-E cmake_ninja_dyndep unknown argument: " + arg);
      return 1;
    }
  }
  if (arg_tdi.empty()) {
    cmSystemTools::Error("-E cmake_ninja_dyndep requires value for --tdi=");
    return 1;
  }
  if (arg_lang.empty()) {
    cmSystemTools::Error("-E cmake_ninja_dyndep requires value for --lang=");
    return 1;
  }
  if (arg_dd.empty()) {
    cmSystemTools::Error("-E cmake_ninja_dyndep requires value for --dd=");
    return 1;
  }

  Json::Value tdio;
  Json::Value const& tdi = tdio;
  {
    cmsys::ifstream tdif(arg_tdi.c_str(), std::ios::in | std::ios::binary);
    Json::Reader reader;
    if (!reader.parse(tdif, tdio, false)) {
      cmSystemTools::Error("-E cmake_ninja_dyndep failed to parse " + arg_tdi +
                           reader.getFormattedErrorMessages());
      return 1;
    }
  }

  std::string const dir_cur_bld = tdi["dir-cur-bld"].asString();
  std::string const dir_cur_src = tdi["dir-cur-src"].asString();
  std::string const dir_top_bld = tdi["dir-top-bld"].asString();
  std::string const dir_top_src = tdi["dir-top-src"].asString();
  std::string module_dir = tdi["module-dir"].asString();
  if (!module_dir.empty() && !cmHasLiteralSuffix(module_dir, "/")) {
    module_dir += "/";
  }
  std::vector<std::string> linked_target_dirs;
  Json::Value const& tdi_linked_target_dirs = tdi["linked-target-dirs"];
  if (tdi_linked_target_dirs.isArray()) {
    for (auto const& tdi_linked_target_dir : tdi_linked_target_dirs) {
      linked_target_dirs.push_back(tdi_linked_target_dir.asString());
    }
  }

  cmake cm(cmake::RoleInternal, cmState::Unknown);
  cm.SetHomeDirectory(dir_top_src);
  cm.SetHomeOutputDirectory(dir_top_bld);
  std::unique_ptr<cmGlobalNinjaGenerator> ggd(
    static_cast<cmGlobalNinjaGenerator*>(cm.CreateGlobalGenerator("Ninja")));
  if (!ggd ||
      !ggd->WriteDyndepFile(dir_top_src, dir_top_bld, dir_cur_src, dir_cur_bld,
                            arg_dd, arg_ddis, module_dir, linked_target_dirs,
                            arg_lang)) {
    return 1;
  }
  return 0;
}